

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

void Abc_NtkFillTruthStore(word (*TruthStore) [1024])

{
  word *pwVar1;
  undefined4 uVar2;
  word wVar3;
  long lVar4;
  uint uVar5;
  word (*pawVar6) [1024];
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  if ((*TruthStore)[0] == 0) {
    lVar4 = 0;
    pawVar6 = TruthStore;
    do {
      wVar3 = Abc_NtkFillTruthStore::Truth6[lVar4];
      uVar2 = *(undefined4 *)((long)Abc_NtkFillTruthStore::Truth6 + lVar4 * 8 + 4);
      lVar7 = 0;
      do {
        pwVar1 = *pawVar6 + lVar7;
        *(int *)pwVar1 = (int)wVar3;
        *(undefined4 *)((long)pwVar1 + 4) = uVar2;
        *(int *)(pwVar1 + 1) = (int)wVar3;
        *(undefined4 *)((long)pwVar1 + 0xc) = uVar2;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x400);
      lVar4 = lVar4 + 1;
      pawVar6 = pawVar6 + 1;
    } while (lVar4 != 6);
    pawVar6 = TruthStore + 6;
    lVar4 = 6;
    do {
      uVar5 = 1 << ((char)lVar4 - 6U & 0x1f);
      lVar7 = 0;
      uVar8 = 0;
      uVar9 = 1;
      do {
        uVar10 = uVar5 & uVar8;
        uVar11 = uVar5 & uVar9;
        pwVar1 = *pawVar6 + lVar7;
        *(uint *)pwVar1 = -(uint)(uVar10 == 0) ^ 0xffffffff;
        *(uint *)((long)pwVar1 + 4) = -(uint)(uVar10 == 0) ^ 0xffffffff;
        *(uint *)(pwVar1 + 1) = -(uint)(uVar11 == 0) ^ 0xffffffff;
        *(uint *)((long)pwVar1 + 0xc) = -(uint)(uVar11 == 0) ^ 0xffffffff;
        lVar7 = lVar7 + 2;
        uVar8 = uVar8 + 2;
        uVar9 = uVar9 + 2;
      } while (lVar7 != 0x400);
      lVar4 = lVar4 + 1;
      pawVar6 = pawVar6 + 1;
    } while (lVar4 != 0x10);
  }
  return;
}

Assistant:

void Abc_NtkFillTruthStore( word TruthStore[16][1<<10] )
{
    if ( TruthStore[0][0] == 0 )
    {
        static word Truth6[6] = {
            0xAAAAAAAAAAAAAAAA,
            0xCCCCCCCCCCCCCCCC,
            0xF0F0F0F0F0F0F0F0,
            0xFF00FF00FF00FF00,
            0xFFFF0000FFFF0000,
            0xFFFFFFFF00000000
        };
        int nVarsMax = 16;
        int nWordsMax = (1 << 10);
        int i, k;
        assert( nVarsMax <= 16 );
        for ( i = 0; i < 6; i++ )
            for ( k = 0; k < nWordsMax; k++ )
                TruthStore[i][k] = Truth6[i];
        for ( i = 6; i < nVarsMax; i++ )
            for ( k = 0; k < nWordsMax; k++ )
                TruthStore[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
    }
}